

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::extractCliques
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,bool transformRows)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  double dVar3;
  double dVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  CliqueVar CVar8;
  HighsMipSolverData *pHVar9;
  HighsMipSolverData *pHVar10;
  pointer piVar11;
  HighsLp *pHVar12;
  ValueType *pVVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  vector<double,_std::allocator<double>_> *pvVar15;
  long lVar16;
  pointer pCVar17;
  u64 uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong in_R9;
  ulong uVar22;
  int iVar23;
  _Head_base<0UL,_unsigned_char_*,_false> _Var24;
  _Head_base<0UL,_unsigned_char_*,_false> _Var25;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> _Var26;
  _Head_base<0UL,_unsigned_char_*,_false> _Var27;
  HighsInt col_2;
  double local_140;
  HighsInt col;
  undefined4 uStack_134;
  double local_130;
  vector<signed_char,_std::allocator<signed_char>_> complementation;
  vector<double,_std::allocator<double>_> vals;
  vector<int,_std::allocator<int>_> inds;
  double local_a8;
  int local_90;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  HighsHashTable<int,_double> entries;
  vector<int,_std::allocator<int>_> perm;
  
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  HighsHashTable<int,_double>::HighsHashTable(&entries);
  pHVar12 = mipsolver->model_;
  if (pHVar12->num_row_ != 0) {
    pHVar9 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    pvVar1 = &(pHVar9->domain).col_upper_;
    pvVar15 = &(pHVar9->domain).col_lower_;
    uVar22 = 0;
    do {
      pHVar10 = (mipsolver->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      if (mipsolver->orig_model_->num_row_ <=
          *(int *)(*(long *)&(pHVar10->postSolveStack).origRowIndex.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar22 * 4))
      break;
      lVar20 = *(long *)&(pHVar10->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      iVar19 = *(int *)(lVar20 + uVar22 * 4);
      lVar21 = (long)iVar19;
      iVar6 = *(int *)(lVar20 + 4 + uVar22 * 4);
      dVar3 = (pHVar12->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22];
      if ((dVar3 != 1.0) || (NAN(dVar3))) {
joined_r0x00260486:
        if ((transformRows) && (this->numEntries < this->maxEntries)) {
          local_130 = 0.0;
          if (iVar19 != iVar6) {
            local_130 = 0.0;
            do {
              pHVar10 = (mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              iVar19 = *(int *)(*(long *)&(pHVar10->ARindex_).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                               lVar21 * 4);
              _col = (double)CONCAT44(uStack_134,iVar19);
              local_a8 = *(double *)
                          (*(long *)&(pHVar10->ARvalue_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          lVar21 * 8);
              piVar11 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start;
              iVar19 = piVar11[iVar19];
              if (iVar19 != 0) {
                do {
                  CVar8 = (this->substitutions).
                          super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)iVar19 + -1].replace;
                  if (-1 < (int)CVar8) {
                    local_130 = local_130 + local_a8;
                    local_a8 = -local_a8;
                  }
                  _col = (double)(CONCAT44(uStack_134,CVar8) & 0xffffffff7fffffff);
                  iVar19 = piVar11[(uint)CVar8 & 0x7fffffff];
                } while (iVar19 != 0);
              }
              pVVar13 = HighsHashTable<int,_double>::operator[](&entries,&col);
              *pVVar13 = local_a8 + *pVVar13;
              lVar21 = lVar21 + 1;
            } while (iVar6 != (int)lVar21);
          }
          local_a8 = (mipsolver->model_->row_upper_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
          if (local_a8 < INFINITY) {
            if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish !=
                inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start) {
              inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            }
            if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            _Var2._M_head_impl =
                 (uchar *)((long)entries.metadata._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1 +
                          entries.tableSizeMask);
            _Var27._M_head_impl = _Var2._M_head_impl;
            if (entries.numElements != 0) {
              cVar5 = *(char *)entries.metadata._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              _Var24._M_head_impl =
                   (uchar *)entries.metadata._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              for (uVar18 = entries.tableSizeMask;
                  (_Var27._M_head_impl = _Var24._M_head_impl, -1 < cVar5 &&
                  (_Var27._M_head_impl = _Var2._M_head_impl, uVar18 != 0)); uVar18 = uVar18 - 1) {
                _Var24._M_head_impl = _Var24._M_head_impl + 1;
                cVar5 = *_Var24._M_head_impl;
              }
            }
            if (_Var27._M_head_impl != _Var2._M_head_impl) {
              lVar20 = (entries.tableSizeMask + 1) * 0x10 +
                       (long)entries.entries._M_t.
                             super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
                             .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>.
                             _M_head_impl;
              _Var24._M_head_impl =
                   (uchar *)((long)entries.metadata._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            entries.tableSizeMask);
              local_a8 = local_a8 - local_130;
              local_90 = 0;
              do {
                lVar16 = ((long)_Var27._M_head_impl - (long)_Var2._M_head_impl) * 0x10;
                col_2 = *(int *)(lVar20 + lVar16);
                lVar21 = (long)col_2;
                _col = *(double *)(lVar20 + 8 + lVar16);
                if (((mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon <=
                    ABS(_col)) {
                  if (((*(char *)(*(long *)&(((pHVar9->domain).mipsolver)->model_->integrality_).
                                            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                            ._M_impl + lVar21) != '\0') &&
                      (dVar3 = *(double *)
                                (*(long *)&(pvVar15->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl + lVar21 * 8), dVar3 == 0.0)) && (!NAN(dVar3))) {
                    local_90 = local_90 +
                               (uint)(*(double *)
                                       (*(long *)&(pvVar1->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl + lVar21 * 8) == 1.0);
                  }
                  if (0.0 <= _col) {
                    if (*(double *)
                         (*(long *)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl + lVar21 * 8) <= -INFINITY) goto LAB_00260938;
                    if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)&vals,
                                 (iterator)
                                 vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(double *)&col);
                    }
                    else {
                      *vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = _col;
                      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&inds,
                                 (iterator)
                                 inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&col_2);
                    }
                    else {
                      *inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = col_2;
                      inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_140 = (double)CONCAT71(local_140._1_7_,1);
                    pvVar14 = pvVar15;
                    if (complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<signed_char,_std::allocator<signed_char>_>::
                      _M_realloc_insert<signed_char>
                                (&complementation,
                                 (iterator)
                                 complementation.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(char *)&local_140);
                    }
                    else {
                      *complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish = '\x01';
                      complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           complementation.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  else {
                    if (INFINITY <=
                        *(double *)
                         (*(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl + lVar21 * 8)) goto LAB_00260938;
                    local_140 = -_col;
                    if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                (&vals,(iterator)
                                       vals.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&local_140);
                    }
                    else {
                      *vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_140;
                      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&inds,
                                 (iterator)
                                 inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&col_2);
                    }
                    else {
                      *inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = col_2;
                      inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_140 = (double)CONCAT71(local_140._1_7_,0xff);
                    pvVar14 = pvVar1;
                    if (complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<signed_char,_std::allocator<signed_char>_>::
                      _M_realloc_insert<signed_char>
                                (&complementation,
                                 (iterator)
                                 complementation.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(char *)&local_140);
                    }
                    else {
                      *complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish = -1;
                      complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           complementation.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  local_a8 = local_a8 -
                             _col * *(double *)
                                     (*(long *)&(pvVar14->
                                                super__Vector_base<double,_std::allocator<double>_>)
                                                ._M_impl + (long)col_2 * 8);
                }
                do {
                  _Var26.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                       (_Head_base<0UL,_unsigned_char_*,_false>)
                       (_Head_base<0UL,_unsigned_char_*,_false>)_Var27._M_head_impl;
                  _Var25._M_head_impl =
                       (uchar *)((long)_Var26.super__Head_base<0UL,_unsigned_char_*,_false>.
                                       _M_head_impl + 1);
                  _Var27._M_head_impl = _Var2._M_head_impl;
                  if (_Var25._M_head_impl == _Var2._M_head_impl) break;
                  _Var27._M_head_impl = _Var25._M_head_impl;
                } while (-1 < (char)*_Var25._M_head_impl);
              } while (_Var26.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
                       (_Head_base<0UL,_unsigned_char_*,_false>)_Var24._M_head_impl);
              if ((local_90 != 0) &&
                 (extractCliques(this,mipsolver,&inds,&vals,&complementation,local_a8,
                                 (HighsInt)in_R9,&perm,&clique,
                                 ((mipsolver->mipdata_)._M_t.
                                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)
                                 ->feastol), (pHVar9->domain).infeasible_ != false)) break;
            }
          }
LAB_00260938:
          dVar3 = (mipsolver->model_->row_lower_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22];
          if (-INFINITY < dVar3) {
            if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish !=
                inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start) {
              inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            }
            if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            _Var2._M_head_impl =
                 (uchar *)((long)entries.metadata._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1 +
                          entries.tableSizeMask);
            _Var27._M_head_impl = _Var2._M_head_impl;
            if (entries.numElements != 0) {
              cVar5 = *(char *)entries.metadata._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              _Var24._M_head_impl =
                   (uchar *)entries.metadata._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              for (uVar18 = entries.tableSizeMask;
                  (_Var27._M_head_impl = _Var24._M_head_impl, -1 < cVar5 &&
                  (_Var27._M_head_impl = _Var2._M_head_impl, uVar18 != 0)); uVar18 = uVar18 - 1) {
                _Var24._M_head_impl = _Var24._M_head_impl + 1;
                cVar5 = *_Var24._M_head_impl;
              }
            }
            if (_Var27._M_head_impl != _Var2._M_head_impl) {
              lVar20 = (entries.tableSizeMask + 1) * 0x10 +
                       (long)entries.entries._M_t.
                             super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
                             .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>.
                             _M_head_impl;
              _Var24._M_head_impl =
                   (uchar *)((long)entries.metadata._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            entries.tableSizeMask);
              local_130 = local_130 - dVar3;
              iVar19 = 0;
              do {
                lVar16 = ((long)_Var27._M_head_impl - (long)_Var2._M_head_impl) * 0x10;
                col_2 = *(int *)(lVar20 + lVar16);
                lVar21 = (long)col_2;
                dVar3 = *(double *)(lVar20 + 8 + lVar16);
                _col = -dVar3;
                if (((mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon <=
                    ABS(dVar3)) {
                  if (((*(char *)(*(long *)&(((pHVar9->domain).mipsolver)->model_->integrality_).
                                            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                            ._M_impl + lVar21) != '\0') &&
                      (dVar4 = *(double *)
                                (*(long *)&(pvVar15->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl + lVar21 * 8), dVar4 == 0.0)) && (!NAN(dVar4))) {
                    iVar19 = iVar19 + (uint)(*(double *)
                                              (*(long *)&(pvVar1->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl + lVar21 * 8) == 1.0);
                  }
                  if (dVar3 <= 0.0) {
                    if (*(double *)
                         (*(long *)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl + lVar21 * 8) <= -INFINITY) goto LAB_00260cd5;
                    if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)&vals,
                                 (iterator)
                                 vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(double *)&col);
                    }
                    else {
                      *vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = _col;
                      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&inds,
                                 (iterator)
                                 inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&col_2);
                    }
                    else {
                      *inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = col_2;
                      inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_140 = (double)CONCAT71(local_140._1_7_,1);
                    pvVar14 = pvVar15;
                    if (complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<signed_char,_std::allocator<signed_char>_>::
                      _M_realloc_insert<signed_char>
                                (&complementation,
                                 (iterator)
                                 complementation.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(char *)&local_140);
                    }
                    else {
                      *complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish = '\x01';
                      complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           complementation.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  else {
                    if (INFINITY <=
                        *(double *)
                         (*(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl + lVar21 * 8)) goto LAB_00260cd5;
                    local_140 = dVar3;
                    if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                (&vals,(iterator)
                                       vals.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&local_140);
                    }
                    else {
                      *vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = dVar3;
                      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&inds,
                                 (iterator)
                                 inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&col_2);
                    }
                    else {
                      *inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = col_2;
                      inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_140 = (double)CONCAT71(local_140._1_7_,0xff);
                    pvVar14 = pvVar1;
                    if (complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<signed_char,_std::allocator<signed_char>_>::
                      _M_realloc_insert<signed_char>
                                (&complementation,
                                 (iterator)
                                 complementation.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(char *)&local_140);
                    }
                    else {
                      *complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish = -1;
                      complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           complementation.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  local_130 = local_130 -
                              _col * *(double *)
                                      (*(long *)&(pvVar14->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl + (long)col_2 * 8);
                }
                do {
                  _Var26.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                       (_Head_base<0UL,_unsigned_char_*,_false>)
                       (_Head_base<0UL,_unsigned_char_*,_false>)_Var27._M_head_impl;
                  _Var25._M_head_impl =
                       (uchar *)((long)_Var26.super__Head_base<0UL,_unsigned_char_*,_false>.
                                       _M_head_impl + 1);
                  _Var27._M_head_impl = _Var2._M_head_impl;
                  if (_Var25._M_head_impl == _Var2._M_head_impl) break;
                  _Var27._M_head_impl = _Var25._M_head_impl;
                } while (-1 < (char)*_Var25._M_head_impl);
              } while (_Var26.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
                       (_Head_base<0UL,_unsigned_char_*,_false>)_Var24._M_head_impl);
              if ((iVar19 != 0) &&
                 (extractCliques(this,mipsolver,&inds,&vals,&complementation,local_130,
                                 (HighsInt)in_R9,&perm,&clique,
                                 ((mipsolver->mipdata_)._M_t.
                                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)
                                 ->feastol), (pHVar9->domain).infeasible_ != false)) break;
            }
          }
LAB_00260cd5:
          HighsHashTable<int,_double>::clear(&entries);
        }
      }
      else {
        if (clique.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            clique.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          clique.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               clique.
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        pCVar17 = clique.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (iVar6 != iVar19) {
          iVar23 = iVar6 - iVar19;
          lVar20 = lVar21;
          do {
            pHVar10 = (mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            iVar7 = *(int *)(*(long *)&(pHVar10->ARindex_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl +
                            lVar20 * 4);
            lVar16 = (long)iVar7;
            _col = (double)CONCAT44(uStack_134,iVar7);
            dVar3 = *(double *)
                     (*(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl + lVar16 * 8);
            if ((((dVar3 != 0.0) || (NAN(dVar3))) ||
                (dVar4 = *(double *)
                          (*(long *)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl + lVar16 * 8), dVar4 != 0.0)) || (NAN(dVar4))) {
              if (((((*(char *)(*(long *)&(((pHVar9->domain).mipsolver)->model_->integrality_).
                                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                          ._M_impl + lVar16) == '\0') ||
                    (dVar4 = *(double *)
                              (*(long *)&(pvVar15->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl + lVar16 * 8), dVar4 != 0.0)) ||
                   ((NAN(dVar4) || ((dVar3 != 1.0 || (NAN(dVar3))))))) ||
                  (dVar3 = *(double *)
                            (*(long *)&(pHVar10->ARvalue_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
                            lVar20 * 8), dVar3 != 1.0)) || (NAN(dVar3))) goto joined_r0x00260486;
              local_140 = (double)CONCAT44(local_140._4_4_,1);
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int&,int>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)&clique,&col,(int *)&local_140);
            }
            lVar20 = lVar20 + 1;
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
          pHVar12 = mipsolver->model_;
          pCVar17 = clique.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        in_R9 = uVar22 & 0xffffffff;
        addClique(this,mipsolver,
                  clique.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (HighsInt)
                  ((ulong)((long)pCVar17 -
                          (long)clique.
                                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2),
                  (bool)(-((pHVar12->row_lower_).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar22] == 1.0) & 1),
                  (HighsInt)uVar22);
        if ((pHVar9->domain).infeasible_ != false) break;
      }
      uVar22 = uVar22 + 1;
      pHVar12 = mipsolver->model_;
    } while (uVar22 != (uint)pHVar12->num_row_);
  }
  HighsHashTable<int,_double>::~HighsHashTable(&entries);
  if (clique.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(clique.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsCliqueTable::extractCliques(HighsMipSolver& mipsolver,
                                      bool transformRows) {
  std::vector<HighsInt> inds;
  std::vector<double> vals;
  std::vector<HighsInt> perm;
  std::vector<int8_t> complementation;
  std::vector<CliqueVar> clique;
  HighsHashTable<HighsInt, double> entries;
  double offset;

  double rhs;

  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  for (HighsInt i = 0; i != mipsolver.numRow(); ++i) {
    HighsInt start = mipsolver.mipdata_->ARstart_[i];
    HighsInt end = mipsolver.mipdata_->ARstart_[i + 1];

    if (mipsolver.mipdata_->postSolveStack.getOrigRowIndex(i) >=
        mipsolver.orig_model_->num_row_)
      break;

    // catch set packing and partitioning constraints that already have the form
    // of a clique without transformations and add those cliques with the rows
    // being recorded
    if (mipsolver.rowUpper(i) == 1.0) {
      bool issetppc = true;

      clique.clear();

      for (HighsInt j = start; j != end; ++j) {
        HighsInt col = mipsolver.mipdata_->ARindex_[j];
        if (globaldom.col_upper_[col] == 0.0 &&
            globaldom.col_lower_[col] == 0.0)
          continue;
        if (!globaldom.isBinary(col)) {
          issetppc = false;
          break;
        }

        if (mipsolver.mipdata_->ARvalue_[j] != 1.0) {
          issetppc = false;
          break;
        }

        clique.emplace_back(col, 1);
      }

      if (issetppc) {
        bool equality = mipsolver.rowLower(i) == 1.0;
        addClique(mipsolver, clique.data(), clique.size(), equality, i);
        if (globaldom.infeasible()) return;
        continue;
      }
    }
    if (!transformRows || isFull()) continue;

    offset = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = mipsolver.mipdata_->ARindex_[j];
      double val = mipsolver.mipdata_->ARvalue_[j];

      resolveSubstitution(col, val, offset);
      entries[col] += val;
    }

    if (mipsolver.rowUpper(i) != kHighsInf) {
      rhs = mipsolver.rowUpper(i) - offset;
      inds.clear();
      vals.clear();
      complementation.clear();
      bool freevar = false;
      HighsInt nbin = 0;

      for (const auto& entry : entries) {
        HighsInt col = entry.key();
        double val = entry.value();

        if (std::abs(val) < mipsolver.mipdata_->epsilon) continue;

        if (globaldom.isBinary(col)) ++nbin;

        if (val < 0) {
          if (globaldom.col_upper_[col] == kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(-val);
          inds.push_back(col);
          complementation.push_back(-1);
          rhs -= val * globaldom.col_upper_[col];
        } else {
          if (globaldom.col_lower_[col] == -kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(val);
          inds.push_back(col);
          complementation.push_back(1);
          rhs -= val * globaldom.col_lower_[col];
        }
      }

      if (!freevar && nbin != 0) {
        // printf("extracting cliques from this row:\n");
        // printRow(globaldom, inds.data(), vals.data(), inds.size(),
        //         -kHighsInf, rhs);
        extractCliques(mipsolver, inds, vals, complementation, rhs, nbin, perm,
                       clique, mipsolver.mipdata_->feastol);
        if (globaldom.infeasible()) return;
      }
    }

    if (mipsolver.rowLower(i) != -kHighsInf) {
      rhs = -mipsolver.rowLower(i) + offset;
      inds.clear();
      vals.clear();
      complementation.clear();
      bool freevar = false;
      HighsInt nbin = 0;

      for (const auto& entry : entries) {
        HighsInt col = entry.key();
        double val = -entry.value();
        if (std::abs(val) < mipsolver.mipdata_->epsilon) continue;

        if (globaldom.isBinary(col)) ++nbin;

        if (val < 0) {
          if (globaldom.col_upper_[col] == kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(-val);
          inds.push_back(col);
          complementation.push_back(-1);
          rhs -= val * globaldom.col_upper_[col];
        } else {
          if (globaldom.col_lower_[col] == -kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(val);
          inds.push_back(col);
          complementation.push_back(1);
          rhs -= val * globaldom.col_lower_[col];
        }
      }

      if (!freevar && nbin != 0) {
        // printf("extracting cliques from this row:\n");
        // printRow(globaldom, inds.data(), vals.data(), inds.size(),
        //         -kHighsInf, rhs);
        extractCliques(mipsolver, inds, vals, complementation, rhs, nbin, perm,
                       clique, mipsolver.mipdata_->feastol);
        if (globaldom.infeasible()) return;
      }
    }

    entries.clear();
  }
}